

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O2

int write_s98v2(s98c *ctx,FILE *fp)

{
  uint8_t *puVar1;
  s98deviceinfo *psVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  __s = find_tag_value(ctx,"title");
  uVar11 = 0;
  uVar9 = 0;
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    uVar9 = (int)sVar4 + 1;
  }
  iVar3 = (ctx->header).device_count * 0x10;
  uVar5 = iVar3 + 0x30;
  if (__s == (char *)0x0) {
    uVar5 = 0;
  }
  iVar3 = iVar3 + 0x30 + uVar9;
  puVar1 = ctx->p;
  iVar8 = (int)ctx->dump_buffer;
  uVar6 = ((int)ctx->loop_start - iVar8) + iVar3;
  if (ctx->loop_start == (uint8_t *)0x0) {
    uVar6 = 0;
  }
  iVar7 = (int)ctx->dump_start - iVar8;
  if (ctx->dump_start == (uint8_t *)0x0) {
    iVar7 = 0;
  }
  (ctx->header).offset_to_tag = uVar5;
  (ctx->header).offset_to_dump = iVar7 + iVar3;
  (ctx->header).offset_to_loop = uVar6;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  write_dword(fp,(ctx->header).timer_numerator);
  write_dword(fp,(ctx->header).timer_denominator);
  write_dword(fp,0);
  write_dword(fp,(ctx->header).offset_to_tag);
  write_dword(fp,(ctx->header).offset_to_dump);
  write_dword(fp,(ctx->header).offset_to_loop);
  write_dword(fp,0);
  lVar10 = 0xc;
  for (; uVar11 < (ctx->header).device_count; uVar11 = uVar11 + 1) {
    psVar2 = ctx->devices;
    write_dword(fp,*(uint32_t *)((long)psVar2 + lVar10 + -0xc));
    write_dword(fp,*(uint32_t *)((long)psVar2 + lVar10 + -8));
    write_dword(fp,*(uint32_t *)((long)psVar2 + lVar10 + -4));
    write_dword(fp,*(uint32_t *)((long)&psVar2->device + lVar10));
    lVar10 = lVar10 + 0x10;
  }
  write_dword(fp,0);
  write_dword(fp,0);
  write_dword(fp,0);
  write_dword(fp,0);
  if (0 < (int)uVar9) {
    fwrite(__s,1,(ulong)uVar9,(FILE *)fp);
  }
  fwrite(ctx->dump_buffer,1,(long)((int)puVar1 - iVar8),(FILE *)fp);
  return 0;
}

Assistant:

int write_s98v2(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    char* title = find_tag_value(ctx, "title");
    int tag_length = (title == NULL) ? 0 : strlen(title) + 1;
    int devices_size = sizeof(struct s98deviceinfo) * (ctx->header.device_count + 1);
    int dump_offset = header_size + devices_size + tag_length;
    int tag_offset = (title == NULL) ? 0 : header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, 0);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    write_dword(fp, s98NONE);
    write_dword(fp, 0);
    write_dword(fp, 0);
    write_dword(fp, 0);
    
    if(tag_length > 0) {
        fwrite(title, 1, tag_length, fp);
    }
        
    fwrite(ctx->dump_buffer, 1, dump_length, fp);

    return 0;
}